

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

bool __thiscall
glslang::TSymbolTableLevel::insertAnonymousMembers
          (TSymbolTableLevel *this,TSymbol *symbol,int firstMember)

{
  uint m_00;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  TType *this_00;
  ulong uVar4;
  size_type sVar5;
  TAnonMember *this_01;
  const_reference pvVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  byte extraout_DL;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
  *__x;
  TSymbol local_80;
  __enable_if_t<is_constructible<value_type,_const_pair<const_basic_string<char,_char_traits<char>,_pool_allocator<char>_>,_TSymbol_*>_>::value,_pair<iterator,_bool>_>
  *local_50;
  TAnonMember *local_40;
  TAnonMember *member;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvStack_30;
  uint m;
  TTypeList *types;
  TSymbol *pTStack_20;
  int firstMember_local;
  TSymbol *symbol_local;
  TSymbolTableLevel *this_local;
  
  types._4_4_ = firstMember;
  pTStack_20 = symbol;
  symbol_local = (TSymbol *)this;
  iVar1 = (*symbol->_vptr_TSymbol[9])();
  this_00 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x60))();
  pvStack_30 = &TType::getStruct(this_00)->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  member._4_4_ = types._4_4_;
  while( true ) {
    uVar4 = (ulong)member._4_4_;
    sVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                      (pvStack_30);
    if (sVar5 <= uVar4) {
      return true;
    }
    this_01 = (TAnonMember *)TSymbol::operator_new((TSymbol *)0x40,(size_t)symbol);
    pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (pvStack_30,(ulong)member._4_4_);
    iVar1 = (*pvVar6->type->_vptr_TType[6])();
    m_00 = member._4_4_;
    iVar2 = (*pTStack_20->_vptr_TSymbol[9])();
    iVar3 = (*pTStack_20->_vptr_TSymbol[9])();
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0xe8))();
    TAnonMember::TAnonMember
              (this_01,(TString *)CONCAT44(extraout_var_00,iVar1),m_00,
               (TVariable *)CONCAT44(extraout_var_01,iVar2),iVar3);
    local_40 = this_01;
    iVar1 = (*(this_01->super_TSymbol)._vptr_TSymbol[6])();
    symbol = &local_80;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
    ::pair<glslang::TAnonMember_*&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
                *)symbol,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               CONCAT44(extraout_var_03,iVar1),&local_40);
    local_50 = std::
               map<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,glslang::TSymbol*,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
               ::
               insert<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>const>
                         ((__enable_if_t<is_constructible<value_type,_const_pair<const_basic_string<char,_char_traits<char>,_pool_allocator<char>_>,_TSymbol_*>_>::value,_pair<iterator,_bool>_>
                           *)this,symbol,__x);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
             *)&local_80);
    if (((extraout_DL ^ 0xff) & 1) != 0) break;
    member._4_4_ = member._4_4_ + 1;
  }
  return false;
}

Assistant:

bool insertAnonymousMembers(TSymbol& symbol, int firstMember)
    {
        const TTypeList& types = *symbol.getAsVariable()->getType().getStruct();
        for (unsigned int m = firstMember; m < types.size(); ++m) {
            TAnonMember* member = new TAnonMember(&types[m].type->getFieldName(), m, *symbol.getAsVariable(), symbol.getAsVariable()->getAnonId());
            if (! level.insert(tLevelPair(member->getMangledName(), member)).second)
                return false;
        }

        return true;
    }